

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O0

void * tommy_trie_remove(tommy_trie *trie,tommy_key_t key)

{
  long lVar1;
  tommy_trie_node *ptVar2;
  long in_FS_OFFSET;
  tommy_trie_node **let_ptr;
  tommy_trie_node *ret;
  tommy_key_t key_local;
  tommy_trie *trie_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = trie_bucket_remove_existing
                     (trie,0x1b,trie->bucket + (key >> 0x1b),(tommy_trie_node *)0x0,key);
  if (ptVar2 == (tommy_trie_node *)0x0) {
    trie_local = (tommy_trie *)0x0;
  }
  else {
    trie->count = trie->count - 1;
    trie_local = (tommy_trie *)ptVar2->data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return trie_local;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_trie_remove(tommy_trie* trie, tommy_key_t key)
{
	tommy_trie_node* ret;
	tommy_trie_node** let_ptr;

	let_ptr = &trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	ret = trie_bucket_remove_existing(trie, TOMMY_TRIE_BUCKET_SHIFT, let_ptr, 0, key);

	if (!ret)
		return 0;

	--trie->count;

	return ret->data;
}